

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

Amount __thiscall
cfd::ConfidentialTransactionContext::CalculateSimpleFee
          (ConfidentialTransactionContext *this,bool append_feature_signed_size,
          bool append_signed_witness)

{
  int iVar1;
  byte in_DL;
  byte in_SIL;
  ConfidentialTransaction *in_RDI;
  Amount AVar2;
  uint32_t add_size;
  uint32_t count;
  uint32_t weight;
  uint32_t rate;
  uint32_t vsize;
  uint32_t size;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint32_t in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  
  (*(in_RDI->super_AbstractTransaction)._vptr_AbstractTransaction[4])();
  (*(in_RDI->super_AbstractTransaction)._vptr_AbstractTransaction[5])();
  if ((in_SIL & 1) != 0) {
    iVar1 = (*(in_RDI->super_AbstractTransaction)._vptr_AbstractTransaction[6])();
    in_stack_ffffffffffffffd0 = core::ConfidentialTransaction::GetTxInCount(in_RDI);
    in_stack_ffffffffffffffcc = in_stack_ffffffffffffffd0 * 0x6c;
    if ((in_DL & 1) == 0) {
      in_stack_ffffffffffffffcc = in_stack_ffffffffffffffd0 * 0x1b0;
    }
    in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffcc + iVar1;
  }
  AVar2 = FeeCalculator::CalculateFee
                    (in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return AVar2;
}

Assistant:

Amount ConfidentialTransactionContext::CalculateSimpleFee(
    bool append_feature_signed_size, bool append_signed_witness) const {
  static constexpr uint32_t kP2wpkhWitnessSize = 72 + 33 + 3;

  uint32_t size = GetTotalSize();
  uint32_t vsize = GetVsize();
  uint32_t rate = FeeCalculator::kRelayMinimumFee;
  if (append_feature_signed_size) {
    uint32_t weight = GetWeight();
    uint32_t count = GetTxInCount();
    uint32_t add_size;
    add_size = kP2wpkhWitnessSize * count;
    if (!append_signed_witness) {
      // no segwit (x4)
      add_size *= 4;
    }
    size += add_size;
    weight += add_size;
    vsize = (weight + 3) / 4;  // wally_tx_vsize_from_weight
  }
  return FeeCalculator::CalculateFee(size, vsize, rate);
}